

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

bool __thiscall
nuraft::asio_rpc_client::verify_certificate
          (asio_rpc_client *this,bool preverified,verify_context *ctx)

{
  element_type *peVar1;
  asio_service_impl *paVar2;
  bool bVar3;
  int iVar4;
  X509 *a;
  X509_NAME *a_00;
  size_t sVar5;
  undefined8 uVar6;
  char subject_name [256];
  string local_148;
  char local_128 [256];
  
  if ((this->impl_->my_opt_).verify_sn_.super__Function_base._M_manager != (_Manager_type)0x0) {
    a = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)ctx->handle_);
    a_00 = X509_get_subject_name(a);
    X509_NAME_oneline(a_00,local_128,0x100);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar4 = (**(code **)(*(long *)peVar1 + 0x38))(), 4 < iVar4)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_148,"given subject: %s",local_128);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"verify_certificate",0x3b8,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
    }
    paVar2 = this->impl_;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    sVar5 = strlen(local_128);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,local_128,local_128 + sVar5);
    if ((paVar2->my_opt_).verify_sn_.super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar6 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      _Unwind_Resume(uVar6);
    }
    bVar3 = (*(paVar2->my_opt_).verify_sn_._M_invoker)
                      ((_Any_data *)&(paVar2->my_opt_).verify_sn_,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    if (!bVar3) {
      preverified = false;
    }
  }
  return preverified;
}

Assistant:

bool verify_certificate(bool preverified,
                            asio::ssl::verify_context& ctx)
    {
        if (impl_->get_options().verify_sn_) {
            char subject_name[256];
            X509* cert = X509_STORE_CTX_get_current_cert( ctx.native_handle() );
            X509_NAME_oneline( X509_get_subject_name(cert), subject_name, 256 );
            p_db("given subject: %s", subject_name);
            if ( !impl_->get_options().verify_sn_(subject_name) ) {
                return false;
            }
        }
        return preverified;
    }